

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BinaryFileFormat.cpp
# Opt level: O2

void __thiscall pbrt::ScaleTexture::readFrom(ScaleTexture *this,BinaryReader *binary)

{
  BinaryReader::read<pbrt::Texture>(binary,&this->tex1);
  BinaryReader::read<pbrt::Texture>(binary,&this->tex2);
  BinaryReader::read<pbrt::math::vec3f,void>(binary,&this->scale1);
  BinaryReader::read<pbrt::math::vec3f,void>(binary,&this->scale2);
  return;
}

Assistant:

void ScaleTexture::readFrom(BinaryReader &binary) 
  {
    Texture::readFrom(binary);
    binary.read(tex1);
    binary.read(tex2);
    binary.read(scale1);
    binary.read(scale2);
  }